

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * bitwise_and_expression(dmr_C *C,token *token,expression **tree)

{
  token *C_00;
  expression *peVar1;
  char *pcVar2;
  expression *peStack_40;
  int op;
  expression *right;
  expression *top;
  token *next;
  expression *left;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  next = (token *)0x0;
  left = (expression *)tree;
  tree_local = (expression **)token;
  token_local = (token *)C;
  top = (expression *)equality_expression(C,token,(expression **)&next);
  if (next != (token *)0x0) {
    while( true ) {
      if ((((uint)*(undefined8 *)top & 0x3f) != 0x11) ||
         (peStack_40 = (expression *)0x0, *(int *)&top->ctype != 0x26)) goto LAB_0010d2e4;
      right = dmrC_alloc_expression((dmr_C *)token_local,*(position *)top,5);
      peVar1 = (expression *)
               equality_expression((dmr_C *)token_local,(token *)top->pos,&stack0xffffffffffffffc0);
      C_00 = token_local;
      top = peVar1;
      if (peStack_40 == (expression *)0x0) break;
      *(ushort *)right =
           *(ushort *)right & 0xff | ((*(ushort *)&next->pos & *(ushort *)peStack_40) >> 8 & 1) << 8
      ;
      right->op = 0x26;
      (right->field_5).field_3.unop = (expression *)next;
      (right->field_5).field_2.string = (string *)peStack_40;
      next = (token *)right;
    }
    pcVar2 = dmrC_show_special((dmr_C *)token_local,0x26);
    dmrC_sparse_error((dmr_C *)C_00,*(position *)peVar1,"No right hand side of \'%s\'-expression",
                      pcVar2);
  }
LAB_0010d2e4:
  *(token **)left = next;
  return (token *)top;
}

Assistant:

static struct token *bitwise_and_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_BINOP, equality_expression,
		(op == '&')
	);
}